

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O2

set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *
ChecksumMethods(set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                *__return_storage_ptr__,uint8_t *buf,int len)

{
  _Rb_tree_header *p_Var1;
  uint16_t uVar2;
  int iVar3;
  ulong in_RAX;
  long lVar4;
  uint8_t uVar5;
  byte bVar6;
  CRC16 crc;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (len < 0x1801) {
    return __return_storage_ptr__;
  }
  uStack_28 = in_RAX;
  if ((uint)len < 0x1803) {
    if (len == 0x1801) goto LAB_00162f89;
  }
  else if ((buf[0x1800] == 0x8c) && (buf[0x1801] == '\x15')) {
    uStack_28._0_4_ = (undefined4)in_RAX;
    uStack_28 = CONCAT44(1,(undefined4)uStack_28);
    std::
    _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
    ::_M_insert_unique<ChecksumType>
              (&__return_storage_ptr__->_M_t,(ChecksumType *)((long)&uStack_28 + 4));
  }
  CRC16::CRC16((CRC16 *)((long)&uStack_28 + 2),buf,0x1802,0xd2f6);
  uVar2 = CRC16::operator_cast_to_unsigned_short((CRC16 *)((long)&uStack_28 + 2));
  if (uVar2 == 0) {
    uStack_28 = CONCAT44(5,(undefined4)uStack_28);
    std::
    _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
    ::_M_insert_unique<ChecksumType>
              (&__return_storage_ptr__->_M_t,(ChecksumType *)((long)&uStack_28 + 4));
  }
  if (0x1803 < (uint)len) {
    CRC16::CRC16((CRC16 *)((long)&uStack_28 + 2),buf,0x1804,0xd2f6);
    uVar2 = CRC16::operator_cast_to_unsigned_short((CRC16 *)((long)&uStack_28 + 2));
    if (uVar2 == 0) {
      uStack_28 = CONCAT44(6,(undefined4)uStack_28);
      std::
      _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
      ::_M_insert_unique<ChecksumType>
                (&__return_storage_ptr__->_M_t,(ChecksumType *)((long)&uStack_28 + 4));
    }
  }
LAB_00162f89:
  uVar5 = '\0';
  for (lVar4 = 0; lVar4 != 0x1800; lVar4 = lVar4 + 1) {
    uVar5 = uVar5 + buf[lVar4];
  }
  if (buf[0x1800] == uVar5) {
    uStack_28 = CONCAT44(2,(undefined4)uStack_28);
    std::
    _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
    ::_M_insert_unique<ChecksumType>
              (&__return_storage_ptr__->_M_t,(ChecksumType *)((long)&uStack_28 + 4));
  }
  bVar6 = 0;
  for (lVar4 = 0; lVar4 != 0x1800; lVar4 = lVar4 + 1) {
    bVar6 = bVar6 ^ buf[lVar4];
  }
  if (buf[0x1800] == bVar6) {
    uStack_28 = CONCAT44(3,(undefined4)uStack_28);
    std::
    _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
    ::_M_insert_unique<ChecksumType>
              (&__return_storage_ptr__->_M_t,(ChecksumType *)((long)&uStack_28 + 4));
  }
  if (0x189f < len) {
    for (lVar4 = -0xa0; lVar4 != 0; lVar4 = lVar4 + 1) {
      bVar6 = bVar6 ^ buf[lVar4 + 0x18a0];
    }
    if (buf[0x18a0] == bVar6) {
      uStack_28 = CONCAT44(4,(undefined4)uStack_28);
      std::
      _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
      ::_M_insert_unique<ChecksumType>
                (&__return_storage_ptr__->_M_t,(ChecksumType *)((long)&uStack_28 + 4));
    }
  }
  if (((__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) &&
     (iVar3 = bcmp(buf,buf + 1,0x17ff), iVar3 == 0)) {
    uStack_28 = uStack_28 & 0xffffffff;
    std::
    _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
    ::_M_insert_unique<ChecksumType>
              (&__return_storage_ptr__->_M_t,(ChecksumType *)((long)&uStack_28 + 4));
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<ChecksumType> ChecksumMethods(const uint8_t* buf, int len)
{
    std::set<ChecksumType> methods;

    // If there's not enough data, there can be no checksum. Return an empty set.
    if (len <= 0x1800)
        return methods;

    // 2-byte CRC
    {
        // Check for CRC of 8C 15, which seems to be a strange fixed checksum found on some disks.
        // This is known to be used by The Cycles (+3), Vigilante (CPC), and Les Hits de Noel (CPC).
        if (len >= 0x1803 && buf[0x1800] == 0x8c && buf[0x1801] == 0x15)
            methods.insert(ChecksumType::Constant_8C15);

        // Calculate the CRC-16 of the first 0x1800 bytes, using a custom CRC init of D2F6.
        // This is known to be used by JPP's Goal Busters (CPC).
        if (len >= 0x1802)
        {
            CRC16 crc(buf, 0x1800 + 2, 0xd2f6); // include CRC bytes
            if (!crc)
                methods.insert(ChecksumType::CRC_D2F6_1800);
        }

        // Calculate the CRC-16 of the first 0x1802 bytes, using a custom CRC init of D2F6.
        // This is known to be used by Les Fous du Foot (CPC).
        if (len >= 0x1804)
        {
            CRC16 crc(buf, 0x1802 + 2, 0xd2f6); // include CRC bytes
            if (!crc)
                methods.insert(ChecksumType::CRC_D2F6_1802);
        }
    }

    // 1-byte checksum
    {
        // Sum the first 6K
        auto sum = static_cast<uint8_t>(std::accumulate(buf, buf + 0x1800, 0));
        if (buf[0x1800] == sum)
            methods.insert(ChecksumType::Sum_1800);

        // XOR together the first 6K
        auto xor_ = static_cast<uint8_t>(
            std::accumulate(buf, buf + 0x1800, 0, std::bit_xor<int>()));
        if (buf[0x1800] == xor_)
            methods.insert(ChecksumType::XOR_1800);

        if (len >= 0x18a0)
        {
            // Extend the XOR to 0x18a0 bytes, as needed for Coin-Op Hits
            xor_ = static_cast<uint8_t>(
                std::accumulate(buf + 0x1800, buf + 0x18a0, xor_, std::bit_xor<uint8_t>()));
            if (buf[0x18a0] == xor_)
                methods.insert(ChecksumType::XOR_18A0);
        }
    }

    // Check 6K of filler on unused tracks (Vigilante on CPC)
    // This is only done if we haven't yet matched another method.
    if (methods.empty() && !memcmp(buf, buf + 1, 0x17ff))
        methods.insert(ChecksumType::None);

    return methods;
}